

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O1

bool __thiscall license::EventRegistry::turnWarningsIntoErrors(EventRegistry *this)

{
  _Rb_tree_header *p_Var1;
  pointer_conflict paVar2;
  _Rb_tree_node_base *p_Var3;
  pointer_conflict paVar4;
  bool bVar5;
  
  if ((this->mostAdvancedLogIdx_by_LicenseId)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
  {
    p_Var3 = (this->mostAdvancedLogIdx_by_LicenseId)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    p_Var1 = &(this->mostAdvancedLogIdx_by_LicenseId)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      paVar4 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = false;
      do {
        if (paVar4[*(long *)(p_Var3 + 2)].severity - SVRT_WARN < 2) {
          paVar4[*(long *)(p_Var3 + 2)].severity = SVRT_ERROR;
          bVar5 = true;
        }
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
      goto LAB_0011b82f;
    }
  }
  bVar5 = false;
LAB_0011b82f:
  if (!bVar5) {
    paVar2 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (paVar4 = (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
                  super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1) {
      if (paVar4->severity == SVRT_WARN) {
        paVar4->severity = SVRT_ERROR;
        bVar5 = true;
      }
    }
  }
  return bVar5;
}

Assistant:

bool EventRegistry::turnWarningsIntoErrors() {
	bool eventFound = false;
	if (mostAdvancedLogIdx_by_LicenseId.size() > 0) {
		for (const auto &mostAdvLogIter : mostAdvancedLogIdx_by_LicenseId) {
			AuditEvent &currentLog = logs[mostAdvLogIter.second];
			if (currentLog.severity == SVRT_WARN || currentLog.severity == SVRT_ERROR) {
				currentLog.severity = SVRT_ERROR;
				eventFound = true;
			}
		}
	}
	if (!eventFound) {
		for (auto it = logs.begin(); it != logs.end(); ++it) {
			if (it->severity == SVRT_WARN) {
				it->severity = SVRT_ERROR;
				eventFound = true;
			}
		}
	}
	return eventFound;
}